

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::fix_in_buffer(jpeg_decoder *this)

{
  int iVar1;
  uint8 *puVar2;
  uint8 uVar3;
  uint8 uVar4;
  uint uVar5;
  
  if ((this->m_bits_left & 7U) != 0) {
    __assert_fail("(m_bits_left & 7) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                  ,0x528,"void jpgd::jpeg_decoder::fix_in_buffer()");
  }
  if (this->m_bits_left == 0x10) {
    puVar2 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar2 + -1;
    puVar2[-1] = (uint8)this->m_bit_buf;
    this->m_in_buf_left = this->m_in_buf_left + 1;
  }
  if (7 < this->m_bits_left) {
    uVar3 = *(uint8 *)((long)&this->m_bit_buf + 1);
    puVar2 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar2 + -1;
    puVar2[-1] = uVar3;
    this->m_in_buf_left = this->m_in_buf_left + 1;
  }
  uVar3 = *(uint8 *)((long)&this->m_bit_buf + 2);
  puVar2 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = puVar2 + -1;
  puVar2[-1] = uVar3;
  this->m_in_buf_left = this->m_in_buf_left + 1;
  uVar3 = *(uint8 *)((long)&this->m_bit_buf + 3);
  puVar2 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = puVar2 + -1;
  puVar2[-1] = uVar3;
  iVar1 = this->m_in_buf_left;
  this->m_in_buf_left = iVar1 + 1;
  this->m_bits_left = 0;
  uVar5 = this->m_bit_buf << 0x10;
  this->m_bit_buf = uVar5;
  if (iVar1 < 1) {
LAB_0014e598:
    uVar3 = get_octet(this);
    uVar4 = get_octet(this);
    this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
  }
  else {
    puVar2 = this->m_pIn_buf_ofs;
    if ((*puVar2 == 0xff) || (puVar2[1] == 0xff)) goto LAB_0014e598;
    this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
    this->m_in_buf_left = iVar1 + -1;
    this->m_pIn_buf_ofs = puVar2 + 2;
  }
  iVar1 = this->m_bits_left;
  this->m_bit_buf = this->m_bit_buf << (-(char)iVar1 & 0x1fU);
  this->m_bits_left = iVar1 + 0x10;
  if (iVar1 < -0x10) goto LAB_0014e69a;
  iVar1 = this->m_bits_left;
  this->m_bits_left = iVar1 + -0x10;
  if (0x10 < iVar1) {
    this->m_bit_buf = this->m_bit_buf << 0x10;
    return;
  }
  uVar5 = this->m_bit_buf << ((byte)iVar1 & 0x1f);
  this->m_bit_buf = uVar5;
  if (this->m_in_buf_left < 2) {
LAB_0014e654:
    uVar3 = get_octet(this);
    uVar4 = get_octet(this);
    this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
  }
  else {
    puVar2 = this->m_pIn_buf_ofs;
    if ((*puVar2 == 0xff) || (puVar2[1] == 0xff)) goto LAB_0014e654;
    this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
    this->m_in_buf_left = this->m_in_buf_left + -2;
    this->m_pIn_buf_ofs = puVar2 + 2;
  }
  iVar1 = this->m_bits_left;
  this->m_bit_buf = this->m_bit_buf << (-(char)iVar1 & 0x1fU);
  this->m_bits_left = iVar1 + 0x10;
  if (-0x11 < iVar1) {
    return;
  }
LAB_0014e69a:
  __assert_fail("m_bits_left >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                ,0x203,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
}

Assistant:

void jpeg_decoder::fix_in_buffer()
	{
		// In case any 0xFF's where pulled into the buffer during marker scanning.
		assert((m_bits_left & 7) == 0);

		if (m_bits_left == 16)
			stuff_char((uint8)(m_bit_buf & 0xFF));

		if (m_bits_left >= 8)
			stuff_char((uint8)((m_bit_buf >> 8) & 0xFF));

		stuff_char((uint8)((m_bit_buf >> 16) & 0xFF));
		stuff_char((uint8)((m_bit_buf >> 24) & 0xFF));

		m_bits_left = 16;
		get_bits_no_markers(16);
		get_bits_no_markers(16);
	}